

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O2

void __thiscall sha1::SHA1::processBlock(SHA1 *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  size_t i;
  long lVar7;
  uint uVar8;
  size_t i_2;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint32_t uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    uVar8 = *(uint *)(this->m_block + lVar7 * 4);
    auStack_184[lVar7 + 3] =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  }
  for (lVar7 = 0x10; lVar7 != 0x50; lVar7 = lVar7 + 1) {
    uVar8 = auStack_198[lVar7] ^ auStack_184[lVar7] ^ auStack_1b8[lVar7 + 2] ^ auStack_1b8[lVar7];
    auStack_184[lVar7 + 3] = uVar8 << 1 | (uint)((int)uVar8 < 0);
  }
  uVar8 = this->m_digest[1];
  uVar1 = this->m_digest[3];
  uVar2 = this->m_digest[4];
  uVar5 = this->m_digest[0];
  uVar10 = uVar8;
  uVar6 = this->m_digest[2];
  uVar13 = uVar1;
  uVar11 = uVar2;
  for (uVar9 = 0; uVar12 = uVar13, uVar13 = uVar6, uVar15 = uVar5, uVar9 != 0x50; uVar9 = uVar9 + 1)
  {
    if (uVar9 < 0x14) {
      uVar16 = (uVar13 ^ uVar12) & uVar10 ^ uVar12;
      iVar14 = 0x5a827999;
    }
    else if (uVar9 < 0x28) {
      uVar16 = uVar13 ^ uVar10 ^ uVar12;
      iVar14 = 0x6ed9eba1;
    }
    else if (uVar9 < 0x3c) {
      uVar16 = uVar12 & uVar13 | (uVar12 | uVar13) & uVar10;
      iVar14 = -0x70e44324;
    }
    else {
      uVar16 = uVar13 ^ uVar10 ^ uVar12;
      iVar14 = -0x359d3e2a;
    }
    lVar7 = uVar9 + 3;
    uVar3 = uVar10 << 0x1e;
    uVar4 = uVar10 >> 2;
    uVar5 = uVar11 + (uVar15 << 5 | uVar15 >> 0x1b) + uVar16 + iVar14 + auStack_184[lVar7];
    uVar10 = uVar15;
    uVar6 = uVar3 | uVar4;
    uVar11 = uVar12;
  }
  this->m_digest[0] = uVar15 + this->m_digest[0];
  this->m_digest[1] = uVar10 + uVar8;
  this->m_digest[2] = uVar13 + this->m_digest[2];
  this->m_digest[3] = uVar12 + uVar1;
  this->m_digest[4] = uVar11 + uVar2;
  return;
}

Assistant:

void processBlock() {
    uint32_t w[80];
    for (size_t i = 0; i < 16; i++) {
      w[i] = (m_block[i * 4 + 0] << 24);
      w[i] |= (m_block[i * 4 + 1] << 16);
      w[i] |= (m_block[i * 4 + 2] << 8);
      w[i] |= (m_block[i * 4 + 3]);
    }
    for (size_t i = 16; i < 80; i++) {
      w[i] = LeftRotate((w[i - 3] ^ w[i - 8] ^ w[i - 14] ^ w[i - 16]), 1);
    }

    uint32_t a = m_digest[0];
    uint32_t b = m_digest[1];
    uint32_t c = m_digest[2];
    uint32_t d = m_digest[3];
    uint32_t e = m_digest[4];

    for (std::size_t i = 0; i < 80; ++i) {
      uint32_t f = 0;
      uint32_t k = 0;

      if (i < 20) {
        f = (b & c) | (~b & d);
        k = 0x5A827999;
      } else if (i < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (i < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }
      uint32_t temp = LeftRotate(a, 5) + f + e + k + w[i];
      e = d;
      d = c;
      c = LeftRotate(b, 30);
      b = a;
      a = temp;
    }

    m_digest[0] += a;
    m_digest[1] += b;
    m_digest[2] += c;
    m_digest[3] += d;
    m_digest[4] += e;
  }